

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall anon_unknown.dwarf_50a29::Loop1Expr::parse_term(Loop1Expr *this,Context *con)

{
  uint uVar1;
  element_type *peVar2;
  undefined1 local_40 [8];
  ParsingState st;
  Context *con_local;
  Loop1Expr *this_local;
  
  st.matches = (size_t)con;
  peVar2 = std::__shared_ptr_access<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_UnaryExpr).expr);
  uVar1 = (*peVar2->_vptr_Expr[3])(peVar2,st.matches);
  if ((uVar1 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    do {
      ParsingState::ParsingState((ParsingState *)local_40,(Context *)st.matches);
      peVar2 = std::__shared_ptr_access<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(this->super_UnaryExpr).expr);
      uVar1 = (*peVar2->_vptr_Expr[3])(peVar2,st.matches);
    } while ((uVar1 & 1) != 0);
    pegmatite::Context::restore((Context *)st.matches,(ParsingState *)local_40);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

virtual bool parse_term(Context &con) const
	{
		//parse the first; if the first fails, stop
		if (!expr->parse_term(con)) return false;

		//parse the rest until no more parsing is possible
		for(;;)
		{
			ParsingState st(con);
			if (!expr->parse_term(con))
			{
				con.restore(st);
				break;
			}
		}

		return true;
	}